

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O0

bool __thiscall Flatten::inlineFunction(Flatten *this,Function *F,Function *Caller)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  FunctionPass *pFVar4;
  ret_type pCVar5;
  undefined8 local_1d0;
  function_ref<llvm::AssumptionCache_&(llvm::Function_&)> local_1c8;
  undefined1 local_1b8 [8];
  InlineFunctionInfo IFI;
  CallInst *CallSite;
  Function *Caller_local;
  Function *F_local;
  Flatten *this_local;
  
  uVar3 = llvm::Function::hasFnAttribute((AttrKind)F);
  if ((uVar3 & 1) == 0) {
    uVar3 = llvm::GlobalValue::isDeclaration();
    if ((uVar3 & 1) == 0) {
      IFI._384_8_ = anon_unknown.dwarf_51720::MergeCalls::mergeCallSites(Caller,F);
      if ((CallInst *)IFI._384_8_ == (CallInst *)0x0) {
        __assert_fail("CallSite && \"MergeCalls did not return a unified callsite\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/SheLLVM[P]SheLLVM/llvm/FlattenPass.cpp"
                      ,0x23,"bool Flatten::inlineFunction(Function *, Function *)");
      }
      if (this->reg2mem == (FunctionPass *)0x0) {
        pFVar4 = (FunctionPass *)llvm::createDemoteRegisterToMemoryPass();
        this->reg2mem = pFVar4;
      }
      (**(code **)(*(long *)this->reg2mem + 0x88))(this->reg2mem,Caller);
      llvm::function_ref<llvm::AssumptionCache_&(llvm::Function_&)>::function_ref
                (&local_1c8,(nullptr_t)0x0);
      llvm::InlineFunctionInfo::InlineFunctionInfo
                ((InlineFunctionInfo *)local_1b8,(CallGraph *)0x0,local_1c8,
                 (ProfileSummaryInfo *)0x0,(BlockFrequencyInfo *)0x0,(BlockFrequencyInfo *)0x0,true)
      ;
      pCVar5 = llvm::cast<llvm::CallBase,llvm::CallInst>((CallInst *)IFI._384_8_);
      local_1d0 = llvm::InlineFunction
                            (pCVar5,(InlineFunctionInfo *)local_1b8,(AAResults *)0x0,true,
                             (Function *)0x0);
      bVar1 = llvm::InlineResult::isSuccess((InlineResult *)&local_1d0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar2 = llvm::Function::isDefTriviallyDead();
        if ((bVar2 & 1) != 0) {
          llvm::Function::eraseFromParent();
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      llvm::InlineFunctionInfo::~InlineFunctionInfo((InlineFunctionInfo *)local_1b8);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Flatten::inlineFunction(Function *F, Function *Caller) {
  if (F->hasFnAttribute(Attribute::NoInline)) {
    // Function not eligible for inlining. Bail out.
    return false;
  }

  if (F->isDeclaration()) {
    // Function is declared, and not defined. Bail out.
    return false;
  }

  // First, run the MergeCalls pass on it:
  CallInst *CallSite = MergeCalls::mergeCallSites(Caller, F);
  assert(CallSite && "MergeCalls did not return a unified callsite");

  if (reg2mem == nullptr)
    reg2mem = llvm::createDemoteRegisterToMemoryPass();
  reg2mem->runOnFunction(*Caller);

  // Coerce LLVM to inline the function.
  InlineFunctionInfo IFI;
  if (!InlineFunction(cast<CallBase>(*CallSite), IFI).isSuccess()) {
    return false;
  }

  // If F is now completely dead, we can erase it from the module.
  if (F->isDefTriviallyDead()) {
    F->eraseFromParent();
  }

  return true;
}